

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack1to16.h
# Opt level: O0

void ncnn::deconvolution_pack1to16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  ulong uVar20;
  ushort uVar21;
  long *plVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  undefined1 auVar102 [32];
  undefined1 auVar103 [40];
  undefined1 auVar104 [48];
  undefined1 auVar105 [56];
  undefined1 auVar106 [32];
  undefined1 auVar107 [40];
  undefined1 auVar108 [48];
  undefined1 auVar109 [56];
  int iVar110;
  int iVar111;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m512 _w;
  __m512 _val;
  int k;
  float val;
  int sx;
  int sxs;
  int x;
  float *sptr;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m512 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m512 _b;
  __m512 _a;
  __m512 max;
  __m512 min;
  __mmask16 _is_negative;
  __m512 one;
  __m512 one_7;
  __m512 pow2n_1;
  __m512 y_2;
  __mmask16 mask_1;
  __m512 one_2;
  __m512i imm0_1;
  __m512 fx_1;
  __m512 tmp_1;
  __m512 pow2n;
  __m512 y_1;
  __mmask16 mask;
  __m512 one_1;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m512 two;
  __m512 one_4;
  __m512 one_5;
  __m512 pow2n_2;
  __m512 y_4;
  __mmask16 mask_3;
  __m512 one_6;
  __m512i imm0_3;
  __m512 fx_2;
  __m512 tmp_3;
  __m512 y_3;
  __m512 z;
  __m512 tmp_2;
  __mmask16 mask_2;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one_3;
  __m512i imm0_2;
  int local_5ebc;
  int local_5ea4;
  int local_5e54;
  long local_5e08;
  undefined1 local_5e00 [64];
  int local_5dac;
  int local_5da8;
  undefined1 (*local_5d38) [64];
  int local_5d2c;
  undefined1 local_5740 [64];
  int local_4ac0;
  int iStack_4abc;
  int iStack_4ab8;
  int iStack_4ab4;
  int iStack_4ab0;
  int iStack_4aac;
  int iStack_4aa8;
  int iStack_4aa4;
  int iStack_4aa0;
  int iStack_4a9c;
  int iStack_4a98;
  int iStack_4a94;
  int iStack_4a90;
  int iStack_4a8c;
  int iStack_4a88;
  int iStack_4a84;
  undefined1 local_4740 [256];
  undefined1 local_4640 [16];
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 uStack_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined1 local_3d40 [256];
  undefined1 local_3c40 [16];
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  undefined8 uStack_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  int local_3240;
  int iStack_323c;
  int iStack_3238;
  int iStack_3234;
  int iStack_3230;
  int iStack_322c;
  int iStack_3228;
  int iStack_3224;
  int iStack_3220;
  int iStack_321c;
  int iStack_3218;
  int iStack_3214;
  int iStack_3210;
  int iStack_320c;
  int iStack_3208;
  int iStack_3204;
  int local_30c0;
  int iStack_30bc;
  int iStack_30b8;
  int iStack_30b4;
  int iStack_30b0;
  int iStack_30ac;
  int iStack_30a8;
  int iStack_30a4;
  int iStack_30a0;
  int iStack_309c;
  int iStack_3098;
  int iStack_3094;
  int iStack_3090;
  int iStack_308c;
  int iStack_3088;
  int iStack_3084;
  undefined1 local_24c0 [256];
  undefined1 local_23c0 [16];
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  int local_19c0;
  int iStack_19bc;
  int iStack_19b8;
  int iStack_19b4;
  int iStack_19b0;
  int iStack_19ac;
  int iStack_19a8;
  int iStack_19a4;
  int iStack_19a0;
  int iStack_199c;
  int iStack_1998;
  int iStack_1994;
  int iStack_1990;
  int iStack_198c;
  int iStack_1988;
  int iStack_1984;
  undefined1 local_15c0 [256];
  undefined1 local_14c0 [16];
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 local_13c0 [16];
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  int local_780;
  int iStack_77c;
  int iStack_778;
  int iStack_774;
  int iStack_770;
  int iStack_76c;
  int iStack_768;
  int iStack_764;
  int iStack_760;
  int iStack_75c;
  int iStack_758;
  int iStack_754;
  int iStack_750;
  int iStack_74c;
  int iStack_748;
  int iStack_744;
  int local_140;
  int iStack_13c;
  int iStack_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int iStack_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int iStack_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int iStack_108;
  int iStack_104;
  
  lVar98 = in_RSI[7];
  lVar3 = *in_RCX;
  for (local_5d2c = 0; local_5d2c < (int)lVar98; local_5d2c = local_5d2c + 1) {
    local_5d38 = (undefined1 (*) [64])(*in_RSI + in_RSI[8] * (long)local_5d2c * in_RSI[2]);
    iVar1 = *(int *)((long)in_RDI + 0x2c);
    lVar99 = in_RDI[6];
    lVar100 = in_RDI[7];
    iVar2 = *(int *)((long)in_RSI + 0x2c);
    lVar101 = in_RSI[6];
    for (local_5da8 = 0; local_5da8 < (int)lVar101; local_5da8 = local_5da8 + 1) {
      for (local_5dac = 0; local_5dac < iVar2; local_5dac = local_5dac + 1) {
        local_5e00 = ZEXT1664(ZEXT816(0));
        if (lVar3 != 0) {
          local_5e00 = *(undefined1 (*) [64])(lVar3 + (long)(local_5d2c << 4) * 4);
        }
        local_5e08 = *in_RDX + in_RDX[8] * (long)local_5d2c * in_RDX[2];
        for (local_5e54 = 0; local_5e54 < (int)lVar100; local_5e54 = local_5e54 + 1) {
          for (local_5ea4 = 0; local_5ea4 < in_R9D; local_5ea4 = local_5ea4 + 1) {
            iVar110 = (local_5da8 + local_5ea4 * dilation_w) - dilation_w * (in_R9D + -1);
            if (((-1 < iVar110) && (iVar110 % stride_w == 0)) && (iVar110 / stride_w < (int)lVar99))
            {
              for (local_5ebc = 0; local_5ebc < in_R8D; local_5ebc = local_5ebc + 1) {
                iVar111 = (local_5dac + local_5ebc * in_stack_00000008) -
                          in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar111) && (iVar111 % dilation_h == 0)) &&
                   (iVar111 / dilation_h < iVar1)) {
                  auVar112 = vbroadcastss_avx512f
                                       (ZEXT416(*(uint *)(*in_RDI + in_RDI[8] * (long)local_5e54 *
                                                                    in_RDI[2] +
                                                          (long)*(int *)((long)in_RDI + 0x2c) *
                                                          (long)(iVar110 / stride_w) * in_RDI[2] +
                                                         (long)(iVar111 / dilation_h) * 4)));
                  local_5e00 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                    (local_5e08 +
                                                    (long)((local_5ea4 * in_R8D + local_5ebc) * 0x10
                                                          ) * 4),auVar112,local_5e00);
                }
              }
            }
          }
          local_5e08 = local_5e08 + (long)(in_R8D * in_R9D * 0x10) * 4;
        }
        plVar22 = (long *)CONCAT44(in_stack_00000034,activation_type);
        switch(stride_h) {
        case 1:
          local_5740 = vmaxps_avx512f(local_5e00,ZEXT1664(ZEXT816(0)));
          break;
        case 2:
          uVar19 = vcmpps_avx512f(local_5e00,ZEXT1664(ZEXT816(0)),1);
          uVar21 = (ushort)uVar19;
          auVar112 = vbroadcastss_avx512f(ZEXT416(*(uint *)*plVar22));
          local_4ac0 = local_5e00._0_4_;
          iStack_4abc = local_5e00._4_4_;
          iStack_4ab8 = local_5e00._8_4_;
          iStack_4ab4 = local_5e00._12_4_;
          iStack_4ab0 = local_5e00._16_4_;
          iStack_4aac = local_5e00._20_4_;
          iStack_4aa8 = local_5e00._24_4_;
          iStack_4aa4 = local_5e00._28_4_;
          iStack_4aa0 = local_5e00._32_4_;
          iStack_4a9c = local_5e00._36_4_;
          iStack_4a98 = local_5e00._40_4_;
          iStack_4a94 = local_5e00._44_4_;
          iStack_4a90 = local_5e00._48_4_;
          iStack_4a8c = local_5e00._52_4_;
          iStack_4a88 = local_5e00._56_4_;
          iStack_4a84 = local_5e00._60_4_;
          auVar112 = vmulps_avx512f(local_5e00,auVar112);
          bVar4 = (bool)((byte)uVar19 & 1);
          bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar21 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar21 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
          bVar11 = (bool)((byte)(uVar21 >> 7) & 1);
          bVar12 = (byte)((ulong)uVar19 >> 8);
          bVar13 = (bool)(bVar12 >> 1 & 1);
          bVar14 = (bool)(bVar12 >> 2 & 1);
          bVar15 = (bool)(bVar12 >> 3 & 1);
          bVar16 = (bool)(bVar12 >> 4 & 1);
          bVar17 = (bool)(bVar12 >> 5 & 1);
          bVar18 = (bool)(bVar12 >> 6 & 1);
          local_5740._4_4_ = (uint)bVar5 * auVar112._4_4_ | (uint)!bVar5 * iStack_4abc;
          local_5740._0_4_ = (uint)bVar4 * auVar112._0_4_ | (uint)!bVar4 * local_4ac0;
          local_5740._8_4_ = (uint)bVar6 * auVar112._8_4_ | (uint)!bVar6 * iStack_4ab8;
          local_5740._12_4_ = (uint)bVar7 * auVar112._12_4_ | (uint)!bVar7 * iStack_4ab4;
          local_5740._16_4_ = (uint)bVar8 * auVar112._16_4_ | (uint)!bVar8 * iStack_4ab0;
          local_5740._20_4_ = (uint)bVar9 * auVar112._20_4_ | (uint)!bVar9 * iStack_4aac;
          local_5740._24_4_ = (uint)bVar10 * auVar112._24_4_ | (uint)!bVar10 * iStack_4aa8;
          local_5740._28_4_ = (uint)bVar11 * auVar112._28_4_ | (uint)!bVar11 * iStack_4aa4;
          local_5740._32_4_ =
               (uint)(bVar12 & 1) * auVar112._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_4aa0;
          local_5740._36_4_ = (uint)bVar13 * auVar112._36_4_ | (uint)!bVar13 * iStack_4a9c;
          local_5740._40_4_ = (uint)bVar14 * auVar112._40_4_ | (uint)!bVar14 * iStack_4a98;
          local_5740._44_4_ = (uint)bVar15 * auVar112._44_4_ | (uint)!bVar15 * iStack_4a94;
          local_5740._48_4_ = (uint)bVar16 * auVar112._48_4_ | (uint)!bVar16 * iStack_4a90;
          local_5740._52_4_ = (uint)bVar17 * auVar112._52_4_ | (uint)!bVar17 * iStack_4a8c;
          local_5740._56_4_ = (uint)bVar18 * auVar112._56_4_ | (uint)!bVar18 * iStack_4a88;
          local_5740._60_4_ =
               (uint)(bVar12 >> 7) * auVar112._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_4a84;
          break;
        case 3:
          auVar112 = vbroadcastss_avx512f(ZEXT416(*(uint *)*plVar22));
          auVar118 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*plVar22 + 4)));
          auVar112 = vmaxps_avx512f(local_5e00,auVar112);
          local_5740 = vminps_avx512f(auVar112,auVar118);
          break;
        case 4:
          auVar119 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar112 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),local_5e00);
          auVar35._8_4_ = 88.37626;
          auVar35._12_4_ = 88.37626;
          auVar35._0_4_ = 88.37626;
          auVar35._4_4_ = 88.37626;
          auVar35._16_4_ = 88.37626;
          auVar35._20_4_ = 88.37626;
          auVar35._24_4_ = 88.37626;
          auVar35._28_4_ = 88.37626;
          auVar35._32_4_ = 88.37626;
          auVar35._36_4_ = 88.37626;
          auVar35._40_4_ = 88.37626;
          auVar35._44_4_ = 88.37626;
          auVar35._48_4_ = 88.37626;
          auVar35._52_4_ = 88.37626;
          auVar35._56_4_ = 88.37626;
          auVar35._60_4_ = 88.37626;
          auVar112 = vminps_avx512f(auVar112,auVar35);
          auVar34._8_4_ = -88.37626;
          auVar34._12_4_ = -88.37626;
          auVar34._0_4_ = -88.37626;
          auVar34._4_4_ = -88.37626;
          auVar34._16_4_ = -88.37626;
          auVar34._20_4_ = -88.37626;
          auVar34._24_4_ = -88.37626;
          auVar34._28_4_ = -88.37626;
          auVar34._32_4_ = -88.37626;
          auVar34._36_4_ = -88.37626;
          auVar34._40_4_ = -88.37626;
          auVar34._44_4_ = -88.37626;
          auVar34._48_4_ = -88.37626;
          auVar34._52_4_ = -88.37626;
          auVar34._56_4_ = -88.37626;
          auVar34._60_4_ = -88.37626;
          auVar118 = vmaxps_avx512f(auVar112,auVar34);
          auVar33._8_4_ = 1.442695;
          auVar33._12_4_ = 1.442695;
          auVar33._0_4_ = 1.442695;
          auVar33._4_4_ = 1.442695;
          auVar33._16_4_ = 1.442695;
          auVar33._20_4_ = 1.442695;
          auVar33._24_4_ = 1.442695;
          auVar33._28_4_ = 1.442695;
          auVar33._32_4_ = 1.442695;
          auVar33._36_4_ = 1.442695;
          auVar33._40_4_ = 1.442695;
          auVar33._44_4_ = 1.442695;
          auVar33._48_4_ = 1.442695;
          auVar33._52_4_ = 1.442695;
          auVar33._56_4_ = 1.442695;
          auVar33._60_4_ = 1.442695;
          auVar32._8_4_ = 0.5;
          auVar32._12_4_ = 0.5;
          auVar32._0_4_ = 0.5;
          auVar32._4_4_ = 0.5;
          auVar32._16_4_ = 0.5;
          auVar32._20_4_ = 0.5;
          auVar32._24_4_ = 0.5;
          auVar32._28_4_ = 0.5;
          auVar32._32_4_ = 0.5;
          auVar32._36_4_ = 0.5;
          auVar32._40_4_ = 0.5;
          auVar32._44_4_ = 0.5;
          auVar32._48_4_ = 0.5;
          auVar32._52_4_ = 0.5;
          auVar32._56_4_ = 0.5;
          auVar32._60_4_ = 0.5;
          auVar112 = vfmadd213ps_avx512f(auVar33,auVar118,auVar32);
          auVar115 = vrndscaleps_avx512f(auVar112,1);
          uVar19 = vcmpps_avx512f(auVar112,auVar115,1);
          uVar21 = (ushort)uVar19;
          auVar37._8_4_ = 1.0;
          auVar37._12_4_ = 1.0;
          auVar37._0_4_ = 1.0;
          auVar37._4_4_ = 1.0;
          auVar37._16_4_ = 1.0;
          auVar37._20_4_ = 1.0;
          auVar37._24_4_ = 1.0;
          auVar37._28_4_ = 1.0;
          auVar37._32_4_ = 1.0;
          auVar37._36_4_ = 1.0;
          auVar37._40_4_ = 1.0;
          auVar37._44_4_ = 1.0;
          auVar37._48_4_ = 1.0;
          auVar37._52_4_ = 1.0;
          auVar37._56_4_ = 1.0;
          auVar37._60_4_ = 1.0;
          local_3240 = auVar115._0_4_;
          iStack_323c = auVar115._4_4_;
          iStack_3238 = auVar115._8_4_;
          iStack_3234 = auVar115._12_4_;
          iStack_3230 = auVar115._16_4_;
          iStack_322c = auVar115._20_4_;
          iStack_3228 = auVar115._24_4_;
          iStack_3224 = auVar115._28_4_;
          iStack_3220 = auVar115._32_4_;
          iStack_321c = auVar115._36_4_;
          iStack_3218 = auVar115._40_4_;
          iStack_3214 = auVar115._44_4_;
          iStack_3210 = auVar115._48_4_;
          iStack_320c = auVar115._52_4_;
          iStack_3208 = auVar115._56_4_;
          iStack_3204 = auVar115._60_4_;
          auVar112 = vsubps_avx512f(auVar115,auVar37);
          bVar4 = (bool)((byte)uVar19 & 1);
          bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar21 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar21 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
          bVar11 = (bool)((byte)(uVar21 >> 7) & 1);
          bVar12 = (byte)((ulong)uVar19 >> 8);
          bVar13 = (bool)(bVar12 >> 1 & 1);
          bVar14 = (bool)(bVar12 >> 2 & 1);
          bVar15 = (bool)(bVar12 >> 3 & 1);
          bVar16 = (bool)(bVar12 >> 4 & 1);
          bVar17 = (bool)(bVar12 >> 5 & 1);
          bVar18 = (bool)(bVar12 >> 6 & 1);
          local_3c40._4_4_ = (uint)bVar5 * auVar112._4_4_ | (uint)!bVar5 * iStack_323c;
          local_3c40._0_4_ = (uint)bVar4 * auVar112._0_4_ | (uint)!bVar4 * local_3240;
          local_3c40._8_4_ = (uint)bVar6 * auVar112._8_4_ | (uint)!bVar6 * iStack_3238;
          local_3c40._12_4_ = (uint)bVar7 * auVar112._12_4_ | (uint)!bVar7 * iStack_3234;
          uStack_3c30._0_4_ = (uint)bVar8 * auVar112._16_4_ | (uint)!bVar8 * iStack_3230;
          uStack_3c30._4_4_ = (uint)bVar9 * auVar112._20_4_ | (uint)!bVar9 * iStack_322c;
          uStack_3c28._0_4_ = (uint)bVar10 * auVar112._24_4_ | (uint)!bVar10 * iStack_3228;
          uStack_3c28._4_4_ = (uint)bVar11 * auVar112._28_4_ | (uint)!bVar11 * iStack_3224;
          auVar102 = _local_3c40;
          uStack_3c20._0_4_ =
               (uint)(bVar12 & 1) * auVar112._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_3220;
          uStack_3c20._4_4_ = (uint)bVar13 * auVar112._36_4_ | (uint)!bVar13 * iStack_321c;
          auVar103 = _local_3c40;
          uStack_3c18._0_4_ = (uint)bVar14 * auVar112._40_4_ | (uint)!bVar14 * iStack_3218;
          uStack_3c18._4_4_ = (uint)bVar15 * auVar112._44_4_ | (uint)!bVar15 * iStack_3214;
          auVar104 = _local_3c40;
          uStack_3c10._0_4_ = (uint)bVar16 * auVar112._48_4_ | (uint)!bVar16 * iStack_3210;
          uStack_3c10._4_4_ = (uint)bVar17 * auVar112._52_4_ | (uint)!bVar17 * iStack_320c;
          auVar105 = _local_3c40;
          uStack_3c08._0_4_ = (uint)bVar18 * auVar112._56_4_ | (uint)!bVar18 * iStack_3208;
          uStack_3c08._4_4_ =
               (uint)(bVar12 >> 7) * auVar112._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_3204;
          auVar112 = _local_3c40;
          uStack_3c28 = auVar102._24_8_;
          uStack_3c20 = auVar103._32_8_;
          uStack_3c18 = auVar104._40_8_;
          uStack_3c10 = auVar105._48_8_;
          uStack_3c08 = auVar112._56_8_;
          auVar42._16_8_ = uStack_3c30;
          auVar42._0_16_ = local_3c40;
          auVar42._24_8_ = uStack_3c28;
          auVar42._32_8_ = uStack_3c20;
          auVar42._40_8_ = uStack_3c18;
          auVar42._48_8_ = uStack_3c10;
          auVar42._56_8_ = uStack_3c08;
          auVar41._8_4_ = 0.6933594;
          auVar41._12_4_ = 0.6933594;
          auVar41._0_4_ = 0.6933594;
          auVar41._4_4_ = 0.6933594;
          auVar41._16_4_ = 0.6933594;
          auVar41._20_4_ = 0.6933594;
          auVar41._24_4_ = 0.6933594;
          auVar41._28_4_ = 0.6933594;
          auVar41._32_4_ = 0.6933594;
          auVar41._36_4_ = 0.6933594;
          auVar41._40_4_ = 0.6933594;
          auVar41._44_4_ = 0.6933594;
          auVar41._48_4_ = 0.6933594;
          auVar41._52_4_ = 0.6933594;
          auVar41._56_4_ = 0.6933594;
          auVar41._60_4_ = 0.6933594;
          auVar112 = vfnmadd213ps_avx512f(auVar41,auVar42,auVar118);
          auVar40._16_8_ = uStack_3c30;
          auVar40._0_16_ = local_3c40;
          auVar40._24_8_ = uStack_3c28;
          auVar40._32_8_ = uStack_3c20;
          auVar40._40_8_ = uStack_3c18;
          auVar40._48_8_ = uStack_3c10;
          auVar40._56_8_ = uStack_3c08;
          auVar39._8_4_ = -0.00021219444;
          auVar39._12_4_ = -0.00021219444;
          auVar39._0_4_ = -0.00021219444;
          auVar39._4_4_ = -0.00021219444;
          auVar39._16_4_ = -0.00021219444;
          auVar39._20_4_ = -0.00021219444;
          auVar39._24_4_ = -0.00021219444;
          auVar39._28_4_ = -0.00021219444;
          auVar39._32_4_ = -0.00021219444;
          auVar39._36_4_ = -0.00021219444;
          auVar39._40_4_ = -0.00021219444;
          auVar39._44_4_ = -0.00021219444;
          auVar39._48_4_ = -0.00021219444;
          auVar39._52_4_ = -0.00021219444;
          auVar39._56_4_ = -0.00021219444;
          auVar39._60_4_ = -0.00021219444;
          auVar112 = vfnmadd213ps_avx512f(auVar39,auVar40,auVar112);
          auVar118 = vmulps_avx512f(auVar112,auVar112);
          local_3d40._8_4_ = 0.00019875691;
          local_3d40._12_4_ = 0.00019875691;
          local_3d40._0_4_ = 0.00019875691;
          local_3d40._4_4_ = 0.00019875691;
          auVar31._16_4_ = 0.00019875691;
          auVar31._20_4_ = 0.00019875691;
          auVar31._0_16_ = local_3d40._0_16_;
          auVar31._24_4_ = 0.00019875691;
          auVar31._28_4_ = 0.00019875691;
          auVar31._32_4_ = 0.00019875691;
          auVar31._36_4_ = 0.00019875691;
          auVar31._40_4_ = 0.00019875691;
          auVar31._44_4_ = 0.00019875691;
          auVar31._48_4_ = 0.00019875691;
          auVar31._52_4_ = 0.00019875691;
          auVar31._56_4_ = 0.00019875691;
          auVar31._60_4_ = 0.00019875691;
          auVar30._8_4_ = 0.0013981999;
          auVar30._12_4_ = 0.0013981999;
          auVar30._0_4_ = 0.0013981999;
          auVar30._4_4_ = 0.0013981999;
          auVar30._16_4_ = 0.0013981999;
          auVar30._20_4_ = 0.0013981999;
          auVar30._24_4_ = 0.0013981999;
          auVar30._28_4_ = 0.0013981999;
          auVar30._32_4_ = 0.0013981999;
          auVar30._36_4_ = 0.0013981999;
          auVar30._40_4_ = 0.0013981999;
          auVar30._44_4_ = 0.0013981999;
          auVar30._48_4_ = 0.0013981999;
          auVar30._52_4_ = 0.0013981999;
          auVar30._56_4_ = 0.0013981999;
          auVar30._60_4_ = 0.0013981999;
          auVar115 = vfmadd213ps_avx512f(auVar112,auVar31,auVar30);
          auVar29._8_4_ = 0.008333452;
          auVar29._12_4_ = 0.008333452;
          auVar29._0_4_ = 0.008333452;
          auVar29._4_4_ = 0.008333452;
          auVar29._16_4_ = 0.008333452;
          auVar29._20_4_ = 0.008333452;
          auVar29._24_4_ = 0.008333452;
          auVar29._28_4_ = 0.008333452;
          auVar29._32_4_ = 0.008333452;
          auVar29._36_4_ = 0.008333452;
          auVar29._40_4_ = 0.008333452;
          auVar29._44_4_ = 0.008333452;
          auVar29._48_4_ = 0.008333452;
          auVar29._52_4_ = 0.008333452;
          auVar29._56_4_ = 0.008333452;
          auVar29._60_4_ = 0.008333452;
          auVar115 = vfmadd213ps_avx512f(auVar112,auVar115,auVar29);
          auVar28._8_4_ = 0.041665796;
          auVar28._12_4_ = 0.041665796;
          auVar28._0_4_ = 0.041665796;
          auVar28._4_4_ = 0.041665796;
          auVar28._16_4_ = 0.041665796;
          auVar28._20_4_ = 0.041665796;
          auVar28._24_4_ = 0.041665796;
          auVar28._28_4_ = 0.041665796;
          auVar28._32_4_ = 0.041665796;
          auVar28._36_4_ = 0.041665796;
          auVar28._40_4_ = 0.041665796;
          auVar28._44_4_ = 0.041665796;
          auVar28._48_4_ = 0.041665796;
          auVar28._52_4_ = 0.041665796;
          auVar28._56_4_ = 0.041665796;
          auVar28._60_4_ = 0.041665796;
          auVar115 = vfmadd213ps_avx512f(auVar112,auVar115,auVar28);
          auVar27._8_4_ = 0.16666666;
          auVar27._12_4_ = 0.16666666;
          auVar27._0_4_ = 0.16666666;
          auVar27._4_4_ = 0.16666666;
          auVar27._16_4_ = 0.16666666;
          auVar27._20_4_ = 0.16666666;
          auVar27._24_4_ = 0.16666666;
          auVar27._28_4_ = 0.16666666;
          auVar27._32_4_ = 0.16666666;
          auVar27._36_4_ = 0.16666666;
          auVar27._40_4_ = 0.16666666;
          auVar27._44_4_ = 0.16666666;
          auVar27._48_4_ = 0.16666666;
          auVar27._52_4_ = 0.16666666;
          auVar27._56_4_ = 0.16666666;
          auVar27._60_4_ = 0.16666666;
          auVar115 = vfmadd213ps_avx512f(auVar112,auVar115,auVar27);
          auVar26._8_4_ = 0.5;
          auVar26._12_4_ = 0.5;
          auVar26._0_4_ = 0.5;
          auVar26._4_4_ = 0.5;
          auVar26._16_4_ = 0.5;
          auVar26._20_4_ = 0.5;
          auVar26._24_4_ = 0.5;
          auVar26._28_4_ = 0.5;
          auVar26._32_4_ = 0.5;
          auVar26._36_4_ = 0.5;
          auVar26._40_4_ = 0.5;
          auVar26._44_4_ = 0.5;
          auVar26._48_4_ = 0.5;
          auVar26._52_4_ = 0.5;
          auVar26._56_4_ = 0.5;
          auVar26._60_4_ = 0.5;
          auVar115 = vfmadd213ps_avx512f(auVar112,auVar115,auVar26);
          auVar112 = vfmadd213ps_avx512f(auVar118,auVar115,auVar112);
          auVar36._8_4_ = 1.0;
          auVar36._12_4_ = 1.0;
          auVar36._0_4_ = 1.0;
          auVar36._4_4_ = 1.0;
          auVar36._16_4_ = 1.0;
          auVar36._20_4_ = 1.0;
          auVar36._24_4_ = 1.0;
          auVar36._28_4_ = 1.0;
          auVar36._32_4_ = 1.0;
          auVar36._36_4_ = 1.0;
          auVar36._40_4_ = 1.0;
          auVar36._44_4_ = 1.0;
          auVar36._48_4_ = 1.0;
          auVar36._52_4_ = 1.0;
          auVar36._56_4_ = 1.0;
          auVar36._60_4_ = 1.0;
          auVar115 = vaddps_avx512f(auVar112,auVar36);
          auVar47._16_8_ = uStack_3c30;
          auVar47._0_16_ = local_3c40;
          auVar47._24_8_ = uStack_3c28;
          auVar47._32_8_ = uStack_3c20;
          auVar47._40_8_ = uStack_3c18;
          auVar47._48_8_ = uStack_3c10;
          auVar47._56_8_ = uStack_3c08;
          auVar112 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
          vmovdqa64_avx512f(auVar112);
          auVar112 = vcvttps2dq_avx512f(auVar47);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar118 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar112 = vpaddd_avx512f(auVar112,auVar118);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vpslld_avx512f(auVar112,ZEXT416(0x17));
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmulps_avx512f(auVar115,auVar112);
          auVar112 = vaddps_avx512f(auVar119,auVar112);
          local_5740 = vdivps_avx512f(auVar119,auVar112);
          break;
        case 5:
          auVar24._8_4_ = 88.37626;
          auVar24._12_4_ = 88.37626;
          auVar24._0_4_ = 88.37626;
          auVar24._4_4_ = 88.37626;
          auVar24._16_4_ = 88.37626;
          auVar24._20_4_ = 88.37626;
          auVar24._24_4_ = 88.37626;
          auVar24._28_4_ = 88.37626;
          auVar24._32_4_ = 88.37626;
          auVar24._36_4_ = 88.37626;
          auVar24._40_4_ = 88.37626;
          auVar24._44_4_ = 88.37626;
          auVar24._48_4_ = 88.37626;
          auVar24._52_4_ = 88.37626;
          auVar24._56_4_ = 88.37626;
          auVar24._60_4_ = 88.37626;
          auVar112 = vminps_avx512f(local_5e00,auVar24);
          auVar23._8_4_ = -88.37626;
          auVar23._12_4_ = -88.37626;
          auVar23._0_4_ = -88.37626;
          auVar23._4_4_ = -88.37626;
          auVar23._16_4_ = -88.37626;
          auVar23._20_4_ = -88.37626;
          auVar23._24_4_ = -88.37626;
          auVar23._28_4_ = -88.37626;
          auVar23._32_4_ = -88.37626;
          auVar23._36_4_ = -88.37626;
          auVar23._40_4_ = -88.37626;
          auVar23._44_4_ = -88.37626;
          auVar23._48_4_ = -88.37626;
          auVar23._52_4_ = -88.37626;
          auVar23._56_4_ = -88.37626;
          auVar23._60_4_ = -88.37626;
          auVar118 = vmaxps_avx512f(auVar112,auVar23);
          auVar114._8_4_ = 1.442695;
          auVar114._12_4_ = 1.442695;
          auVar114._0_4_ = 1.442695;
          auVar114._4_4_ = 1.442695;
          auVar114._16_4_ = 1.442695;
          auVar114._20_4_ = 1.442695;
          auVar114._24_4_ = 1.442695;
          auVar114._28_4_ = 1.442695;
          auVar114._32_4_ = 1.442695;
          auVar114._36_4_ = 1.442695;
          auVar114._40_4_ = 1.442695;
          auVar114._44_4_ = 1.442695;
          auVar114._48_4_ = 1.442695;
          auVar114._52_4_ = 1.442695;
          auVar114._56_4_ = 1.442695;
          auVar114._60_4_ = 1.442695;
          auVar113._8_4_ = 0.5;
          auVar113._12_4_ = 0.5;
          auVar113._0_4_ = 0.5;
          auVar113._4_4_ = 0.5;
          auVar113._16_4_ = 0.5;
          auVar113._20_4_ = 0.5;
          auVar113._24_4_ = 0.5;
          auVar113._28_4_ = 0.5;
          auVar113._32_4_ = 0.5;
          auVar113._36_4_ = 0.5;
          auVar113._40_4_ = 0.5;
          auVar113._44_4_ = 0.5;
          auVar113._48_4_ = 0.5;
          auVar113._52_4_ = 0.5;
          auVar113._56_4_ = 0.5;
          auVar113._60_4_ = 0.5;
          auVar112 = vfmadd213ps_avx512f(auVar114,auVar118,auVar113);
          auVar119 = vrndscaleps_avx512f(auVar112,1);
          uVar19 = vcmpps_avx512f(auVar112,auVar119,1);
          uVar21 = (ushort)uVar19;
          auVar38._8_4_ = 1.0;
          auVar38._12_4_ = 1.0;
          auVar38._0_4_ = 1.0;
          auVar38._4_4_ = 1.0;
          auVar38._16_4_ = 1.0;
          auVar38._20_4_ = 1.0;
          auVar38._24_4_ = 1.0;
          auVar38._28_4_ = 1.0;
          auVar38._32_4_ = 1.0;
          auVar38._36_4_ = 1.0;
          auVar38._40_4_ = 1.0;
          auVar38._44_4_ = 1.0;
          auVar38._48_4_ = 1.0;
          auVar38._52_4_ = 1.0;
          auVar38._56_4_ = 1.0;
          auVar38._60_4_ = 1.0;
          local_30c0 = auVar119._0_4_;
          iStack_30bc = auVar119._4_4_;
          iStack_30b8 = auVar119._8_4_;
          iStack_30b4 = auVar119._12_4_;
          iStack_30b0 = auVar119._16_4_;
          iStack_30ac = auVar119._20_4_;
          iStack_30a8 = auVar119._24_4_;
          iStack_30a4 = auVar119._28_4_;
          iStack_30a0 = auVar119._32_4_;
          iStack_309c = auVar119._36_4_;
          iStack_3098 = auVar119._40_4_;
          iStack_3094 = auVar119._44_4_;
          iStack_3090 = auVar119._48_4_;
          iStack_308c = auVar119._52_4_;
          iStack_3088 = auVar119._56_4_;
          iStack_3084 = auVar119._60_4_;
          auVar112 = vsubps_avx512f(auVar119,auVar38);
          bVar4 = (bool)((byte)uVar19 & 1);
          bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar21 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar21 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
          bVar11 = (bool)((byte)(uVar21 >> 7) & 1);
          bVar12 = (byte)((ulong)uVar19 >> 8);
          bVar13 = (bool)(bVar12 >> 1 & 1);
          bVar14 = (bool)(bVar12 >> 2 & 1);
          bVar15 = (bool)(bVar12 >> 3 & 1);
          bVar16 = (bool)(bVar12 >> 4 & 1);
          bVar17 = (bool)(bVar12 >> 5 & 1);
          bVar18 = (bool)(bVar12 >> 6 & 1);
          local_4640._4_4_ = (uint)bVar5 * auVar112._4_4_ | (uint)!bVar5 * iStack_30bc;
          local_4640._0_4_ = (uint)bVar4 * auVar112._0_4_ | (uint)!bVar4 * local_30c0;
          local_4640._8_4_ = (uint)bVar6 * auVar112._8_4_ | (uint)!bVar6 * iStack_30b8;
          local_4640._12_4_ = (uint)bVar7 * auVar112._12_4_ | (uint)!bVar7 * iStack_30b4;
          uStack_4630._0_4_ = (uint)bVar8 * auVar112._16_4_ | (uint)!bVar8 * iStack_30b0;
          uStack_4630._4_4_ = (uint)bVar9 * auVar112._20_4_ | (uint)!bVar9 * iStack_30ac;
          uStack_4628._0_4_ = (uint)bVar10 * auVar112._24_4_ | (uint)!bVar10 * iStack_30a8;
          uStack_4628._4_4_ = (uint)bVar11 * auVar112._28_4_ | (uint)!bVar11 * iStack_30a4;
          auVar102 = _local_4640;
          uStack_4620._0_4_ =
               (uint)(bVar12 & 1) * auVar112._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_30a0;
          uStack_4620._4_4_ = (uint)bVar13 * auVar112._36_4_ | (uint)!bVar13 * iStack_309c;
          auVar103 = _local_4640;
          uStack_4618._0_4_ = (uint)bVar14 * auVar112._40_4_ | (uint)!bVar14 * iStack_3098;
          uStack_4618._4_4_ = (uint)bVar15 * auVar112._44_4_ | (uint)!bVar15 * iStack_3094;
          auVar104 = _local_4640;
          uStack_4610._0_4_ = (uint)bVar16 * auVar112._48_4_ | (uint)!bVar16 * iStack_3090;
          uStack_4610._4_4_ = (uint)bVar17 * auVar112._52_4_ | (uint)!bVar17 * iStack_308c;
          auVar105 = _local_4640;
          uStack_4608._0_4_ = (uint)bVar18 * auVar112._56_4_ | (uint)!bVar18 * iStack_3088;
          uStack_4608._4_4_ =
               (uint)(bVar12 >> 7) * auVar112._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_3084;
          auVar112 = _local_4640;
          uStack_4628 = auVar102._24_8_;
          uStack_4620 = auVar103._32_8_;
          uStack_4618 = auVar104._40_8_;
          uStack_4610 = auVar105._48_8_;
          uStack_4608 = auVar112._56_8_;
          auVar46._16_8_ = uStack_4630;
          auVar46._0_16_ = local_4640;
          auVar46._24_8_ = uStack_4628;
          auVar46._32_8_ = uStack_4620;
          auVar46._40_8_ = uStack_4618;
          auVar46._48_8_ = uStack_4610;
          auVar46._56_8_ = uStack_4608;
          auVar45._8_4_ = 0.6933594;
          auVar45._12_4_ = 0.6933594;
          auVar45._0_4_ = 0.6933594;
          auVar45._4_4_ = 0.6933594;
          auVar45._16_4_ = 0.6933594;
          auVar45._20_4_ = 0.6933594;
          auVar45._24_4_ = 0.6933594;
          auVar45._28_4_ = 0.6933594;
          auVar45._32_4_ = 0.6933594;
          auVar45._36_4_ = 0.6933594;
          auVar45._40_4_ = 0.6933594;
          auVar45._44_4_ = 0.6933594;
          auVar45._48_4_ = 0.6933594;
          auVar45._52_4_ = 0.6933594;
          auVar45._56_4_ = 0.6933594;
          auVar45._60_4_ = 0.6933594;
          auVar112 = vfnmadd213ps_avx512f(auVar45,auVar46,auVar118);
          auVar44._16_8_ = uStack_4630;
          auVar44._0_16_ = local_4640;
          auVar44._24_8_ = uStack_4628;
          auVar44._32_8_ = uStack_4620;
          auVar44._40_8_ = uStack_4618;
          auVar44._48_8_ = uStack_4610;
          auVar44._56_8_ = uStack_4608;
          auVar43._8_4_ = -0.00021219444;
          auVar43._12_4_ = -0.00021219444;
          auVar43._0_4_ = -0.00021219444;
          auVar43._4_4_ = -0.00021219444;
          auVar43._16_4_ = -0.00021219444;
          auVar43._20_4_ = -0.00021219444;
          auVar43._24_4_ = -0.00021219444;
          auVar43._28_4_ = -0.00021219444;
          auVar43._32_4_ = -0.00021219444;
          auVar43._36_4_ = -0.00021219444;
          auVar43._40_4_ = -0.00021219444;
          auVar43._44_4_ = -0.00021219444;
          auVar43._48_4_ = -0.00021219444;
          auVar43._52_4_ = -0.00021219444;
          auVar43._56_4_ = -0.00021219444;
          auVar43._60_4_ = -0.00021219444;
          auVar113 = vfnmadd213ps_avx512f(auVar43,auVar44,auVar112);
          auVar114 = vmulps_avx512f(auVar113,auVar113);
          local_4740._8_4_ = 0.00019875691;
          local_4740._12_4_ = 0.00019875691;
          local_4740._0_4_ = 0.00019875691;
          local_4740._4_4_ = 0.00019875691;
          auVar117._16_4_ = 0.00019875691;
          auVar117._20_4_ = 0.00019875691;
          auVar117._0_16_ = local_4740._0_16_;
          auVar117._24_4_ = 0.00019875691;
          auVar117._28_4_ = 0.00019875691;
          auVar117._32_4_ = 0.00019875691;
          auVar117._36_4_ = 0.00019875691;
          auVar117._40_4_ = 0.00019875691;
          auVar117._44_4_ = 0.00019875691;
          auVar117._48_4_ = 0.00019875691;
          auVar117._52_4_ = 0.00019875691;
          auVar117._56_4_ = 0.00019875691;
          auVar117._60_4_ = 0.00019875691;
          auVar116._8_4_ = 0.0013981999;
          auVar116._12_4_ = 0.0013981999;
          auVar116._0_4_ = 0.0013981999;
          auVar116._4_4_ = 0.0013981999;
          auVar116._16_4_ = 0.0013981999;
          auVar116._20_4_ = 0.0013981999;
          auVar116._24_4_ = 0.0013981999;
          auVar116._28_4_ = 0.0013981999;
          auVar116._32_4_ = 0.0013981999;
          auVar116._36_4_ = 0.0013981999;
          auVar116._40_4_ = 0.0013981999;
          auVar116._44_4_ = 0.0013981999;
          auVar116._48_4_ = 0.0013981999;
          auVar116._52_4_ = 0.0013981999;
          auVar116._56_4_ = 0.0013981999;
          auVar116._60_4_ = 0.0013981999;
          auVar112 = vfmadd213ps_avx512f(auVar113,auVar117,auVar116);
          auVar115._8_4_ = 0.008333452;
          auVar115._12_4_ = 0.008333452;
          auVar115._0_4_ = 0.008333452;
          auVar115._4_4_ = 0.008333452;
          auVar115._16_4_ = 0.008333452;
          auVar115._20_4_ = 0.008333452;
          auVar115._24_4_ = 0.008333452;
          auVar115._28_4_ = 0.008333452;
          auVar115._32_4_ = 0.008333452;
          auVar115._36_4_ = 0.008333452;
          auVar115._40_4_ = 0.008333452;
          auVar115._44_4_ = 0.008333452;
          auVar115._48_4_ = 0.008333452;
          auVar115._52_4_ = 0.008333452;
          auVar115._56_4_ = 0.008333452;
          auVar115._60_4_ = 0.008333452;
          auVar112 = vfmadd213ps_avx512f(auVar113,auVar112,auVar115);
          auVar119._8_4_ = 0.041665796;
          auVar119._12_4_ = 0.041665796;
          auVar119._0_4_ = 0.041665796;
          auVar119._4_4_ = 0.041665796;
          auVar119._16_4_ = 0.041665796;
          auVar119._20_4_ = 0.041665796;
          auVar119._24_4_ = 0.041665796;
          auVar119._28_4_ = 0.041665796;
          auVar119._32_4_ = 0.041665796;
          auVar119._36_4_ = 0.041665796;
          auVar119._40_4_ = 0.041665796;
          auVar119._44_4_ = 0.041665796;
          auVar119._48_4_ = 0.041665796;
          auVar119._52_4_ = 0.041665796;
          auVar119._56_4_ = 0.041665796;
          auVar119._60_4_ = 0.041665796;
          auVar112 = vfmadd213ps_avx512f(auVar113,auVar112,auVar119);
          auVar118._8_4_ = 0.16666666;
          auVar118._12_4_ = 0.16666666;
          auVar118._0_4_ = 0.16666666;
          auVar118._4_4_ = 0.16666666;
          auVar118._16_4_ = 0.16666666;
          auVar118._20_4_ = 0.16666666;
          auVar118._24_4_ = 0.16666666;
          auVar118._28_4_ = 0.16666666;
          auVar118._32_4_ = 0.16666666;
          auVar118._36_4_ = 0.16666666;
          auVar118._40_4_ = 0.16666666;
          auVar118._44_4_ = 0.16666666;
          auVar118._48_4_ = 0.16666666;
          auVar118._52_4_ = 0.16666666;
          auVar118._56_4_ = 0.16666666;
          auVar118._60_4_ = 0.16666666;
          auVar118 = vfmadd213ps_avx512f(auVar113,auVar112,auVar118);
          auVar112._8_4_ = 0.5;
          auVar112._12_4_ = 0.5;
          auVar112._0_4_ = 0.5;
          auVar112._4_4_ = 0.5;
          auVar112._16_4_ = 0.5;
          auVar112._20_4_ = 0.5;
          auVar112._24_4_ = 0.5;
          auVar112._28_4_ = 0.5;
          auVar112._32_4_ = 0.5;
          auVar112._36_4_ = 0.5;
          auVar112._40_4_ = 0.5;
          auVar112._44_4_ = 0.5;
          auVar112._48_4_ = 0.5;
          auVar112._52_4_ = 0.5;
          auVar112._56_4_ = 0.5;
          auVar112._60_4_ = 0.5;
          auVar112 = vfmadd213ps_avx512f(auVar113,auVar118,auVar112);
          auVar112 = vfmadd213ps_avx512f(auVar114,auVar112,auVar113);
          auVar25._8_4_ = 1.0;
          auVar25._12_4_ = 1.0;
          auVar25._0_4_ = 1.0;
          auVar25._4_4_ = 1.0;
          auVar25._16_4_ = 1.0;
          auVar25._20_4_ = 1.0;
          auVar25._24_4_ = 1.0;
          auVar25._28_4_ = 1.0;
          auVar25._32_4_ = 1.0;
          auVar25._36_4_ = 1.0;
          auVar25._40_4_ = 1.0;
          auVar25._44_4_ = 1.0;
          auVar25._48_4_ = 1.0;
          auVar25._52_4_ = 1.0;
          auVar25._56_4_ = 1.0;
          auVar25._60_4_ = 1.0;
          auVar119 = vaddps_avx512f(auVar112,auVar25);
          auVar48._16_8_ = uStack_4630;
          auVar48._0_16_ = local_4640;
          auVar48._24_8_ = uStack_4628;
          auVar48._32_8_ = uStack_4620;
          auVar48._40_8_ = uStack_4618;
          auVar48._48_8_ = uStack_4610;
          auVar48._56_8_ = uStack_4608;
          auVar112 = vcvttps2dq_avx512f(auVar48);
          vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar118 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar112 = vpaddd_avx512f(auVar112,auVar118);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vpslld_avx512f(auVar112,ZEXT416(0x17));
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmulps_avx512f(auVar119,auVar112);
          auVar118 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar112 = vaddps_avx512f(auVar112,auVar118);
          uVar20 = vcmpps_avx512f(auVar112,ZEXT1664(ZEXT816(0)),2);
          auVar87._8_4_ = 0x800000;
          auVar87._12_4_ = 0x800000;
          auVar87._0_4_ = 0x800000;
          auVar87._4_4_ = 0x800000;
          auVar87._16_4_ = 0x800000;
          auVar87._20_4_ = 0x800000;
          auVar87._24_4_ = 0x800000;
          auVar87._28_4_ = 0x800000;
          auVar87._32_4_ = 0x800000;
          auVar87._36_4_ = 0x800000;
          auVar87._40_4_ = 0x800000;
          auVar87._44_4_ = 0x800000;
          auVar87._48_4_ = 0x800000;
          auVar87._52_4_ = 0x800000;
          auVar87._56_4_ = 0x800000;
          auVar87._60_4_ = 0x800000;
          auVar118 = vmaxps_avx512f(auVar112,auVar87);
          auVar112 = vmovdqa64_avx512f(auVar118);
          auVar112 = vpsrld_avx512f(auVar112,ZEXT416(0x17));
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar96._8_4_ = -0x7f800001;
          auVar96._12_4_ = -0x7f800001;
          auVar96._0_4_ = -0x7f800001;
          auVar96._4_4_ = -0x7f800001;
          auVar96._16_4_ = -0x7f800001;
          auVar96._20_4_ = -0x7f800001;
          auVar96._24_4_ = -0x7f800001;
          auVar96._28_4_ = -0x7f800001;
          auVar96._32_4_ = -0x7f800001;
          auVar96._36_4_ = -0x7f800001;
          auVar96._40_4_ = -0x7f800001;
          auVar96._44_4_ = -0x7f800001;
          auVar96._48_4_ = -0x7f800001;
          auVar96._52_4_ = -0x7f800001;
          auVar96._56_4_ = -0x7f800001;
          auVar96._60_4_ = -0x7f800001;
          auVar119 = vmovdqa64_avx512f(auVar96);
          auVar118 = vpandd_avx512f(auVar118,auVar119);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar97._8_4_ = 0.5;
          auVar97._12_4_ = 0.5;
          auVar97._0_4_ = 0.5;
          auVar97._4_4_ = 0.5;
          auVar97._16_4_ = 0.5;
          auVar97._20_4_ = 0.5;
          auVar97._24_4_ = 0.5;
          auVar97._28_4_ = 0.5;
          auVar97._32_4_ = 0.5;
          auVar97._36_4_ = 0.5;
          auVar97._40_4_ = 0.5;
          auVar97._44_4_ = 0.5;
          auVar97._48_4_ = 0.5;
          auVar97._52_4_ = 0.5;
          auVar97._56_4_ = 0.5;
          auVar97._60_4_ = 0.5;
          auVar119 = vmovdqa64_avx512f(auVar97);
          auVar118 = vpord_avx512f(auVar118,auVar119);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar119 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar119 = vmovdqa64_avx512f(auVar119);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar119 = vmovdqa64_avx512f(auVar119);
          auVar112 = vpsubd_avx512f(auVar112,auVar119);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vcvtdq2ps_avx512f(auVar112);
          auVar92._8_4_ = 1.0;
          auVar92._12_4_ = 1.0;
          auVar92._0_4_ = 1.0;
          auVar92._4_4_ = 1.0;
          auVar92._16_4_ = 1.0;
          auVar92._20_4_ = 1.0;
          auVar92._24_4_ = 1.0;
          auVar92._28_4_ = 1.0;
          auVar92._32_4_ = 1.0;
          auVar92._36_4_ = 1.0;
          auVar92._40_4_ = 1.0;
          auVar92._44_4_ = 1.0;
          auVar92._48_4_ = 1.0;
          auVar92._52_4_ = 1.0;
          auVar92._56_4_ = 1.0;
          auVar92._60_4_ = 1.0;
          auVar112 = vaddps_avx512f(auVar112,auVar92);
          uVar19 = vcmpps_avx512f(auVar118,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          uVar21 = (ushort)uVar19;
          auVar93._8_4_ = 1.0;
          auVar93._12_4_ = 1.0;
          auVar93._0_4_ = 1.0;
          auVar93._4_4_ = 1.0;
          auVar93._16_4_ = 1.0;
          auVar93._20_4_ = 1.0;
          auVar93._24_4_ = 1.0;
          auVar93._28_4_ = 1.0;
          auVar93._32_4_ = 1.0;
          auVar93._36_4_ = 1.0;
          auVar93._40_4_ = 1.0;
          auVar93._44_4_ = 1.0;
          auVar93._48_4_ = 1.0;
          auVar93._52_4_ = 1.0;
          auVar93._56_4_ = 1.0;
          auVar93._60_4_ = 1.0;
          auVar119 = vsubps_avx512f(auVar118,auVar93);
          auVar94._8_4_ = 1.0;
          auVar94._12_4_ = 1.0;
          auVar94._0_4_ = 1.0;
          auVar94._4_4_ = 1.0;
          auVar94._16_4_ = 1.0;
          auVar94._20_4_ = 1.0;
          auVar94._24_4_ = 1.0;
          auVar94._28_4_ = 1.0;
          auVar94._32_4_ = 1.0;
          auVar94._36_4_ = 1.0;
          auVar94._40_4_ = 1.0;
          auVar94._44_4_ = 1.0;
          auVar94._48_4_ = 1.0;
          auVar94._52_4_ = 1.0;
          auVar94._56_4_ = 1.0;
          auVar94._60_4_ = 1.0;
          local_780 = auVar112._0_4_;
          iStack_77c = auVar112._4_4_;
          iStack_778 = auVar112._8_4_;
          iStack_774 = auVar112._12_4_;
          iStack_770 = auVar112._16_4_;
          iStack_76c = auVar112._20_4_;
          iStack_768 = auVar112._24_4_;
          iStack_764 = auVar112._28_4_;
          iStack_760 = auVar112._32_4_;
          iStack_75c = auVar112._36_4_;
          iStack_758 = auVar112._40_4_;
          iStack_754 = auVar112._44_4_;
          iStack_750 = auVar112._48_4_;
          iStack_74c = auVar112._52_4_;
          iStack_748 = auVar112._56_4_;
          iStack_744 = auVar112._60_4_;
          auVar112 = vsubps_avx512f(auVar112,auVar94);
          bVar4 = (bool)((byte)uVar19 & 1);
          bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar21 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar21 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
          bVar11 = (bool)((byte)(uVar21 >> 7) & 1);
          bVar12 = (byte)((ulong)uVar19 >> 8);
          bVar13 = (bool)(bVar12 >> 1 & 1);
          bVar14 = (bool)(bVar12 >> 2 & 1);
          bVar15 = (bool)(bVar12 >> 3 & 1);
          bVar16 = (bool)(bVar12 >> 4 & 1);
          bVar17 = (bool)(bVar12 >> 5 & 1);
          bVar18 = (bool)(bVar12 >> 6 & 1);
          local_14c0._4_4_ = (uint)bVar5 * auVar112._4_4_ | (uint)!bVar5 * iStack_77c;
          local_14c0._0_4_ = (uint)bVar4 * auVar112._0_4_ | (uint)!bVar4 * local_780;
          local_14c0._8_4_ = (uint)bVar6 * auVar112._8_4_ | (uint)!bVar6 * iStack_778;
          local_14c0._12_4_ = (uint)bVar7 * auVar112._12_4_ | (uint)!bVar7 * iStack_774;
          uStack_14b0._0_4_ = (uint)bVar8 * auVar112._16_4_ | (uint)!bVar8 * iStack_770;
          uStack_14b0._4_4_ = (uint)bVar9 * auVar112._20_4_ | (uint)!bVar9 * iStack_76c;
          uStack_14a8._0_4_ = (uint)bVar10 * auVar112._24_4_ | (uint)!bVar10 * iStack_768;
          uStack_14a8._4_4_ = (uint)bVar11 * auVar112._28_4_ | (uint)!bVar11 * iStack_764;
          auVar102 = _local_14c0;
          uStack_14a0._0_4_ =
               (uint)(bVar12 & 1) * auVar112._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_760;
          uStack_14a0._4_4_ = (uint)bVar13 * auVar112._36_4_ | (uint)!bVar13 * iStack_75c;
          auVar103 = _local_14c0;
          uStack_1498._0_4_ = (uint)bVar14 * auVar112._40_4_ | (uint)!bVar14 * iStack_758;
          uStack_1498._4_4_ = (uint)bVar15 * auVar112._44_4_ | (uint)!bVar15 * iStack_754;
          auVar104 = _local_14c0;
          uStack_1490._0_4_ = (uint)bVar16 * auVar112._48_4_ | (uint)!bVar16 * iStack_750;
          uStack_1490._4_4_ = (uint)bVar17 * auVar112._52_4_ | (uint)!bVar17 * iStack_74c;
          auVar105 = _local_14c0;
          uStack_1488._0_4_ = (uint)bVar18 * auVar112._56_4_ | (uint)!bVar18 * iStack_748;
          uStack_1488._4_4_ =
               (uint)(bVar12 >> 7) * auVar112._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_744;
          auVar112 = _local_14c0;
          local_140 = auVar119._0_4_;
          iStack_13c = auVar119._4_4_;
          iStack_138 = auVar119._8_4_;
          iStack_134 = auVar119._12_4_;
          iStack_130 = auVar119._16_4_;
          iStack_12c = auVar119._20_4_;
          iStack_128 = auVar119._24_4_;
          iStack_124 = auVar119._28_4_;
          iStack_120 = auVar119._32_4_;
          iStack_11c = auVar119._36_4_;
          iStack_118 = auVar119._40_4_;
          iStack_114 = auVar119._44_4_;
          iStack_110 = auVar119._48_4_;
          iStack_10c = auVar119._52_4_;
          iStack_108 = auVar119._56_4_;
          iStack_104 = auVar119._60_4_;
          auVar118 = vaddps_avx512f(auVar119,auVar118);
          bVar4 = (bool)((byte)uVar19 & 1);
          bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar21 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar21 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
          bVar11 = (bool)((byte)(uVar21 >> 7) & 1);
          bVar13 = (bool)(bVar12 >> 1 & 1);
          bVar14 = (bool)(bVar12 >> 2 & 1);
          bVar15 = (bool)(bVar12 >> 3 & 1);
          bVar16 = (bool)(bVar12 >> 4 & 1);
          bVar17 = (bool)(bVar12 >> 5 & 1);
          bVar18 = (bool)(bVar12 >> 6 & 1);
          local_13c0._4_4_ = (uint)bVar5 * auVar118._4_4_ | (uint)!bVar5 * iStack_13c;
          local_13c0._0_4_ = (uint)bVar4 * auVar118._0_4_ | (uint)!bVar4 * local_140;
          local_13c0._8_4_ = (uint)bVar6 * auVar118._8_4_ | (uint)!bVar6 * iStack_138;
          local_13c0._12_4_ = (uint)bVar7 * auVar118._12_4_ | (uint)!bVar7 * iStack_134;
          uStack_13b0._0_4_ = (uint)bVar8 * auVar118._16_4_ | (uint)!bVar8 * iStack_130;
          uStack_13b0._4_4_ = (uint)bVar9 * auVar118._20_4_ | (uint)!bVar9 * iStack_12c;
          uStack_13a8._0_4_ = (uint)bVar10 * auVar118._24_4_ | (uint)!bVar10 * iStack_128;
          uStack_13a8._4_4_ = (uint)bVar11 * auVar118._28_4_ | (uint)!bVar11 * iStack_124;
          auVar106 = _local_13c0;
          uStack_13a0._0_4_ =
               (uint)(bVar12 & 1) * auVar118._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_120;
          uStack_13a0._4_4_ = (uint)bVar13 * auVar118._36_4_ | (uint)!bVar13 * iStack_11c;
          auVar107 = _local_13c0;
          uStack_1398._0_4_ = (uint)bVar14 * auVar118._40_4_ | (uint)!bVar14 * iStack_118;
          uStack_1398._4_4_ = (uint)bVar15 * auVar118._44_4_ | (uint)!bVar15 * iStack_114;
          auVar108 = _local_13c0;
          uStack_1390._0_4_ = (uint)bVar16 * auVar118._48_4_ | (uint)!bVar16 * iStack_110;
          uStack_1390._4_4_ = (uint)bVar17 * auVar118._52_4_ | (uint)!bVar17 * iStack_10c;
          auVar109 = _local_13c0;
          uStack_1388._0_4_ = (uint)bVar18 * auVar118._56_4_ | (uint)!bVar18 * iStack_108;
          uStack_1388._4_4_ =
               (uint)(bVar12 >> 7) * auVar118._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_104;
          auVar118 = _local_13c0;
          uStack_13a8 = auVar106._24_8_;
          uStack_13a0 = auVar107._32_8_;
          uStack_1398 = auVar108._40_8_;
          uStack_1390 = auVar109._48_8_;
          uStack_1388 = auVar118._56_8_;
          auVar90._16_8_ = uStack_13b0;
          auVar90._0_16_ = local_13c0;
          auVar90._24_8_ = uStack_13a8;
          auVar90._32_8_ = uStack_13a0;
          auVar90._40_8_ = uStack_1398;
          auVar90._48_8_ = uStack_1390;
          auVar90._56_8_ = uStack_1388;
          auVar89._16_8_ = uStack_13b0;
          auVar89._0_16_ = local_13c0;
          auVar89._24_8_ = uStack_13a8;
          auVar89._32_8_ = uStack_13a0;
          auVar89._40_8_ = uStack_1398;
          auVar89._48_8_ = uStack_1390;
          auVar89._56_8_ = uStack_1388;
          auVar118 = vmulps_avx512f(auVar90,auVar89);
          local_15c0._8_4_ = 0.070376836;
          local_15c0._12_4_ = 0.070376836;
          local_15c0._0_4_ = 0.070376836;
          local_15c0._4_4_ = 0.070376836;
          auVar86._16_4_ = 0.070376836;
          auVar86._20_4_ = 0.070376836;
          auVar86._0_16_ = local_15c0._0_16_;
          auVar86._24_4_ = 0.070376836;
          auVar86._28_4_ = 0.070376836;
          auVar86._32_4_ = 0.070376836;
          auVar86._36_4_ = 0.070376836;
          auVar86._40_4_ = 0.070376836;
          auVar86._44_4_ = 0.070376836;
          auVar86._48_4_ = 0.070376836;
          auVar86._52_4_ = 0.070376836;
          auVar86._56_4_ = 0.070376836;
          auVar86._60_4_ = 0.070376836;
          auVar85._16_8_ = uStack_13b0;
          auVar85._0_16_ = local_13c0;
          auVar85._24_8_ = uStack_13a8;
          auVar85._32_8_ = uStack_13a0;
          auVar85._40_8_ = uStack_1398;
          auVar85._48_8_ = uStack_1390;
          auVar85._56_8_ = uStack_1388;
          auVar84._8_4_ = -0.1151461;
          auVar84._12_4_ = -0.1151461;
          auVar84._0_4_ = -0.1151461;
          auVar84._4_4_ = -0.1151461;
          auVar84._16_4_ = -0.1151461;
          auVar84._20_4_ = -0.1151461;
          auVar84._24_4_ = -0.1151461;
          auVar84._28_4_ = -0.1151461;
          auVar84._32_4_ = -0.1151461;
          auVar84._36_4_ = -0.1151461;
          auVar84._40_4_ = -0.1151461;
          auVar84._44_4_ = -0.1151461;
          auVar84._48_4_ = -0.1151461;
          auVar84._52_4_ = -0.1151461;
          auVar84._56_4_ = -0.1151461;
          auVar84._60_4_ = -0.1151461;
          auVar119 = vfmadd213ps_avx512f(auVar85,auVar86,auVar84);
          auVar83._16_8_ = uStack_13b0;
          auVar83._0_16_ = local_13c0;
          auVar83._24_8_ = uStack_13a8;
          auVar83._32_8_ = uStack_13a0;
          auVar83._40_8_ = uStack_1398;
          auVar83._48_8_ = uStack_1390;
          auVar83._56_8_ = uStack_1388;
          auVar82._8_4_ = 0.116769984;
          auVar82._12_4_ = 0.116769984;
          auVar82._0_4_ = 0.116769984;
          auVar82._4_4_ = 0.116769984;
          auVar82._16_4_ = 0.116769984;
          auVar82._20_4_ = 0.116769984;
          auVar82._24_4_ = 0.116769984;
          auVar82._28_4_ = 0.116769984;
          auVar82._32_4_ = 0.116769984;
          auVar82._36_4_ = 0.116769984;
          auVar82._40_4_ = 0.116769984;
          auVar82._44_4_ = 0.116769984;
          auVar82._48_4_ = 0.116769984;
          auVar82._52_4_ = 0.116769984;
          auVar82._56_4_ = 0.116769984;
          auVar82._60_4_ = 0.116769984;
          auVar119 = vfmadd213ps_avx512f(auVar83,auVar119,auVar82);
          auVar81._16_8_ = uStack_13b0;
          auVar81._0_16_ = local_13c0;
          auVar81._24_8_ = uStack_13a8;
          auVar81._32_8_ = uStack_13a0;
          auVar81._40_8_ = uStack_1398;
          auVar81._48_8_ = uStack_1390;
          auVar81._56_8_ = uStack_1388;
          auVar80._8_4_ = -0.12420141;
          auVar80._12_4_ = -0.12420141;
          auVar80._0_4_ = -0.12420141;
          auVar80._4_4_ = -0.12420141;
          auVar80._16_4_ = -0.12420141;
          auVar80._20_4_ = -0.12420141;
          auVar80._24_4_ = -0.12420141;
          auVar80._28_4_ = -0.12420141;
          auVar80._32_4_ = -0.12420141;
          auVar80._36_4_ = -0.12420141;
          auVar80._40_4_ = -0.12420141;
          auVar80._44_4_ = -0.12420141;
          auVar80._48_4_ = -0.12420141;
          auVar80._52_4_ = -0.12420141;
          auVar80._56_4_ = -0.12420141;
          auVar80._60_4_ = -0.12420141;
          auVar119 = vfmadd213ps_avx512f(auVar81,auVar119,auVar80);
          auVar79._16_8_ = uStack_13b0;
          auVar79._0_16_ = local_13c0;
          auVar79._24_8_ = uStack_13a8;
          auVar79._32_8_ = uStack_13a0;
          auVar79._40_8_ = uStack_1398;
          auVar79._48_8_ = uStack_1390;
          auVar79._56_8_ = uStack_1388;
          auVar78._8_4_ = 0.14249323;
          auVar78._12_4_ = 0.14249323;
          auVar78._0_4_ = 0.14249323;
          auVar78._4_4_ = 0.14249323;
          auVar78._16_4_ = 0.14249323;
          auVar78._20_4_ = 0.14249323;
          auVar78._24_4_ = 0.14249323;
          auVar78._28_4_ = 0.14249323;
          auVar78._32_4_ = 0.14249323;
          auVar78._36_4_ = 0.14249323;
          auVar78._40_4_ = 0.14249323;
          auVar78._44_4_ = 0.14249323;
          auVar78._48_4_ = 0.14249323;
          auVar78._52_4_ = 0.14249323;
          auVar78._56_4_ = 0.14249323;
          auVar78._60_4_ = 0.14249323;
          auVar119 = vfmadd213ps_avx512f(auVar79,auVar119,auVar78);
          auVar77._16_8_ = uStack_13b0;
          auVar77._0_16_ = local_13c0;
          auVar77._24_8_ = uStack_13a8;
          auVar77._32_8_ = uStack_13a0;
          auVar77._40_8_ = uStack_1398;
          auVar77._48_8_ = uStack_1390;
          auVar77._56_8_ = uStack_1388;
          auVar76._8_4_ = -0.16668057;
          auVar76._12_4_ = -0.16668057;
          auVar76._0_4_ = -0.16668057;
          auVar76._4_4_ = -0.16668057;
          auVar76._16_4_ = -0.16668057;
          auVar76._20_4_ = -0.16668057;
          auVar76._24_4_ = -0.16668057;
          auVar76._28_4_ = -0.16668057;
          auVar76._32_4_ = -0.16668057;
          auVar76._36_4_ = -0.16668057;
          auVar76._40_4_ = -0.16668057;
          auVar76._44_4_ = -0.16668057;
          auVar76._48_4_ = -0.16668057;
          auVar76._52_4_ = -0.16668057;
          auVar76._56_4_ = -0.16668057;
          auVar76._60_4_ = -0.16668057;
          auVar119 = vfmadd213ps_avx512f(auVar77,auVar119,auVar76);
          auVar75._16_8_ = uStack_13b0;
          auVar75._0_16_ = local_13c0;
          auVar75._24_8_ = uStack_13a8;
          auVar75._32_8_ = uStack_13a0;
          auVar75._40_8_ = uStack_1398;
          auVar75._48_8_ = uStack_1390;
          auVar75._56_8_ = uStack_1388;
          auVar74._8_4_ = 0.20000714;
          auVar74._12_4_ = 0.20000714;
          auVar74._0_4_ = 0.20000714;
          auVar74._4_4_ = 0.20000714;
          auVar74._16_4_ = 0.20000714;
          auVar74._20_4_ = 0.20000714;
          auVar74._24_4_ = 0.20000714;
          auVar74._28_4_ = 0.20000714;
          auVar74._32_4_ = 0.20000714;
          auVar74._36_4_ = 0.20000714;
          auVar74._40_4_ = 0.20000714;
          auVar74._44_4_ = 0.20000714;
          auVar74._48_4_ = 0.20000714;
          auVar74._52_4_ = 0.20000714;
          auVar74._56_4_ = 0.20000714;
          auVar74._60_4_ = 0.20000714;
          auVar119 = vfmadd213ps_avx512f(auVar75,auVar119,auVar74);
          auVar73._16_8_ = uStack_13b0;
          auVar73._0_16_ = local_13c0;
          auVar73._24_8_ = uStack_13a8;
          auVar73._32_8_ = uStack_13a0;
          auVar73._40_8_ = uStack_1398;
          auVar73._48_8_ = uStack_1390;
          auVar73._56_8_ = uStack_1388;
          auVar72._8_4_ = -0.24999994;
          auVar72._12_4_ = -0.24999994;
          auVar72._0_4_ = -0.24999994;
          auVar72._4_4_ = -0.24999994;
          auVar72._16_4_ = -0.24999994;
          auVar72._20_4_ = -0.24999994;
          auVar72._24_4_ = -0.24999994;
          auVar72._28_4_ = -0.24999994;
          auVar72._32_4_ = -0.24999994;
          auVar72._36_4_ = -0.24999994;
          auVar72._40_4_ = -0.24999994;
          auVar72._44_4_ = -0.24999994;
          auVar72._48_4_ = -0.24999994;
          auVar72._52_4_ = -0.24999994;
          auVar72._56_4_ = -0.24999994;
          auVar72._60_4_ = -0.24999994;
          auVar119 = vfmadd213ps_avx512f(auVar73,auVar119,auVar72);
          auVar71._16_8_ = uStack_13b0;
          auVar71._0_16_ = local_13c0;
          auVar71._24_8_ = uStack_13a8;
          auVar71._32_8_ = uStack_13a0;
          auVar71._40_8_ = uStack_1398;
          auVar71._48_8_ = uStack_1390;
          auVar71._56_8_ = uStack_1388;
          auVar70._8_4_ = 0.3333333;
          auVar70._12_4_ = 0.3333333;
          auVar70._0_4_ = 0.3333333;
          auVar70._4_4_ = 0.3333333;
          auVar70._16_4_ = 0.3333333;
          auVar70._20_4_ = 0.3333333;
          auVar70._24_4_ = 0.3333333;
          auVar70._28_4_ = 0.3333333;
          auVar70._32_4_ = 0.3333333;
          auVar70._36_4_ = 0.3333333;
          auVar70._40_4_ = 0.3333333;
          auVar70._44_4_ = 0.3333333;
          auVar70._48_4_ = 0.3333333;
          auVar70._52_4_ = 0.3333333;
          auVar70._56_4_ = 0.3333333;
          auVar70._60_4_ = 0.3333333;
          auVar119 = vfmadd213ps_avx512f(auVar71,auVar119,auVar70);
          auVar88._16_8_ = uStack_13b0;
          auVar88._0_16_ = local_13c0;
          auVar88._24_8_ = uStack_13a8;
          auVar88._32_8_ = uStack_13a0;
          auVar88._40_8_ = uStack_1398;
          auVar88._48_8_ = uStack_1390;
          auVar88._56_8_ = uStack_1388;
          auVar119 = vmulps_avx512f(auVar119,auVar88);
          auVar119 = vmulps_avx512f(auVar119,auVar118);
          uStack_14a8 = auVar102._24_8_;
          uStack_14a0 = auVar103._32_8_;
          uStack_1498 = auVar104._40_8_;
          uStack_1490 = auVar105._48_8_;
          uStack_1488 = auVar112._56_8_;
          auVar69._16_8_ = uStack_14b0;
          auVar69._0_16_ = local_14c0;
          auVar69._24_8_ = uStack_14a8;
          auVar69._32_8_ = uStack_14a0;
          auVar69._40_8_ = uStack_1498;
          auVar69._48_8_ = uStack_1490;
          auVar69._56_8_ = uStack_1488;
          auVar68._8_4_ = -0.00021219444;
          auVar68._12_4_ = -0.00021219444;
          auVar68._0_4_ = -0.00021219444;
          auVar68._4_4_ = -0.00021219444;
          auVar68._16_4_ = -0.00021219444;
          auVar68._20_4_ = -0.00021219444;
          auVar68._24_4_ = -0.00021219444;
          auVar68._28_4_ = -0.00021219444;
          auVar68._32_4_ = -0.00021219444;
          auVar68._36_4_ = -0.00021219444;
          auVar68._40_4_ = -0.00021219444;
          auVar68._44_4_ = -0.00021219444;
          auVar68._48_4_ = -0.00021219444;
          auVar68._52_4_ = -0.00021219444;
          auVar68._56_4_ = -0.00021219444;
          auVar68._60_4_ = -0.00021219444;
          auVar112 = vfmadd213ps_avx512f(auVar68,auVar69,auVar119);
          auVar95._8_4_ = 0.5;
          auVar95._12_4_ = 0.5;
          auVar95._0_4_ = 0.5;
          auVar95._4_4_ = 0.5;
          auVar95._16_4_ = 0.5;
          auVar95._20_4_ = 0.5;
          auVar95._24_4_ = 0.5;
          auVar95._28_4_ = 0.5;
          auVar95._32_4_ = 0.5;
          auVar95._36_4_ = 0.5;
          auVar95._40_4_ = 0.5;
          auVar95._44_4_ = 0.5;
          auVar95._48_4_ = 0.5;
          auVar95._52_4_ = 0.5;
          auVar95._56_4_ = 0.5;
          auVar95._60_4_ = 0.5;
          auVar112 = vfnmadd213ps_avx512f(auVar95,auVar118,auVar112);
          auVar91._16_8_ = uStack_13b0;
          auVar91._0_16_ = local_13c0;
          auVar91._24_8_ = uStack_13a8;
          auVar91._32_8_ = uStack_13a0;
          auVar91._40_8_ = uStack_1398;
          auVar91._48_8_ = uStack_1390;
          auVar91._56_8_ = uStack_1388;
          auVar112 = vaddps_avx512f(auVar91,auVar112);
          auVar67._16_8_ = uStack_14b0;
          auVar67._0_16_ = local_14c0;
          auVar67._24_8_ = uStack_14a8;
          auVar67._32_8_ = uStack_14a0;
          auVar67._40_8_ = uStack_1498;
          auVar67._48_8_ = uStack_1490;
          auVar67._56_8_ = uStack_1488;
          auVar66._8_4_ = 0.6933594;
          auVar66._12_4_ = 0.6933594;
          auVar66._0_4_ = 0.6933594;
          auVar66._4_4_ = 0.6933594;
          auVar66._16_4_ = 0.6933594;
          auVar66._20_4_ = 0.6933594;
          auVar66._24_4_ = 0.6933594;
          auVar66._28_4_ = 0.6933594;
          auVar66._32_4_ = 0.6933594;
          auVar66._36_4_ = 0.6933594;
          auVar66._40_4_ = 0.6933594;
          auVar66._44_4_ = 0.6933594;
          auVar66._48_4_ = 0.6933594;
          auVar66._52_4_ = 0.6933594;
          auVar66._56_4_ = 0.6933594;
          auVar66._60_4_ = 0.6933594;
          auVar118 = vfmadd213ps_avx512f(auVar66,auVar67,auVar112);
          auVar112 = vpmovm2d_avx512dq(uVar20 & 0xffff);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vpord_avx512f(auVar118,auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar119 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar115 = vbroadcastss_avx512f(ZEXT416(0x40000000));
          auVar112 = vmulps_avx512f(auVar112,auVar115);
          auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar112 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),auVar112);
          auVar58._8_4_ = 88.37626;
          auVar58._12_4_ = 88.37626;
          auVar58._0_4_ = 88.37626;
          auVar58._4_4_ = 88.37626;
          auVar58._16_4_ = 88.37626;
          auVar58._20_4_ = 88.37626;
          auVar58._24_4_ = 88.37626;
          auVar58._28_4_ = 88.37626;
          auVar58._32_4_ = 88.37626;
          auVar58._36_4_ = 88.37626;
          auVar58._40_4_ = 88.37626;
          auVar58._44_4_ = 88.37626;
          auVar58._48_4_ = 88.37626;
          auVar58._52_4_ = 88.37626;
          auVar58._56_4_ = 88.37626;
          auVar58._60_4_ = 88.37626;
          auVar112 = vminps_avx512f(auVar112,auVar58);
          auVar57._8_4_ = -88.37626;
          auVar57._12_4_ = -88.37626;
          auVar57._0_4_ = -88.37626;
          auVar57._4_4_ = -88.37626;
          auVar57._16_4_ = -88.37626;
          auVar57._20_4_ = -88.37626;
          auVar57._24_4_ = -88.37626;
          auVar57._28_4_ = -88.37626;
          auVar57._32_4_ = -88.37626;
          auVar57._36_4_ = -88.37626;
          auVar57._40_4_ = -88.37626;
          auVar57._44_4_ = -88.37626;
          auVar57._48_4_ = -88.37626;
          auVar57._52_4_ = -88.37626;
          auVar57._56_4_ = -88.37626;
          auVar57._60_4_ = -88.37626;
          auVar118 = vmaxps_avx512f(auVar112,auVar57);
          auVar56._8_4_ = 1.442695;
          auVar56._12_4_ = 1.442695;
          auVar56._0_4_ = 1.442695;
          auVar56._4_4_ = 1.442695;
          auVar56._16_4_ = 1.442695;
          auVar56._20_4_ = 1.442695;
          auVar56._24_4_ = 1.442695;
          auVar56._28_4_ = 1.442695;
          auVar56._32_4_ = 1.442695;
          auVar56._36_4_ = 1.442695;
          auVar56._40_4_ = 1.442695;
          auVar56._44_4_ = 1.442695;
          auVar56._48_4_ = 1.442695;
          auVar56._52_4_ = 1.442695;
          auVar56._56_4_ = 1.442695;
          auVar56._60_4_ = 1.442695;
          auVar55._8_4_ = 0.5;
          auVar55._12_4_ = 0.5;
          auVar55._0_4_ = 0.5;
          auVar55._4_4_ = 0.5;
          auVar55._16_4_ = 0.5;
          auVar55._20_4_ = 0.5;
          auVar55._24_4_ = 0.5;
          auVar55._28_4_ = 0.5;
          auVar55._32_4_ = 0.5;
          auVar55._36_4_ = 0.5;
          auVar55._40_4_ = 0.5;
          auVar55._44_4_ = 0.5;
          auVar55._48_4_ = 0.5;
          auVar55._52_4_ = 0.5;
          auVar55._56_4_ = 0.5;
          auVar55._60_4_ = 0.5;
          auVar112 = vfmadd213ps_avx512f(auVar56,auVar118,auVar55);
          auVar117 = vrndscaleps_avx512f(auVar112,1);
          uVar19 = vcmpps_avx512f(auVar112,auVar117,1);
          uVar21 = (ushort)uVar19;
          auVar60._8_4_ = 1.0;
          auVar60._12_4_ = 1.0;
          auVar60._0_4_ = 1.0;
          auVar60._4_4_ = 1.0;
          auVar60._16_4_ = 1.0;
          auVar60._20_4_ = 1.0;
          auVar60._24_4_ = 1.0;
          auVar60._28_4_ = 1.0;
          auVar60._32_4_ = 1.0;
          auVar60._36_4_ = 1.0;
          auVar60._40_4_ = 1.0;
          auVar60._44_4_ = 1.0;
          auVar60._48_4_ = 1.0;
          auVar60._52_4_ = 1.0;
          auVar60._56_4_ = 1.0;
          auVar60._60_4_ = 1.0;
          local_19c0 = auVar117._0_4_;
          iStack_19bc = auVar117._4_4_;
          iStack_19b8 = auVar117._8_4_;
          iStack_19b4 = auVar117._12_4_;
          iStack_19b0 = auVar117._16_4_;
          iStack_19ac = auVar117._20_4_;
          iStack_19a8 = auVar117._24_4_;
          iStack_19a4 = auVar117._28_4_;
          iStack_19a0 = auVar117._32_4_;
          iStack_199c = auVar117._36_4_;
          iStack_1998 = auVar117._40_4_;
          iStack_1994 = auVar117._44_4_;
          iStack_1990 = auVar117._48_4_;
          iStack_198c = auVar117._52_4_;
          iStack_1988 = auVar117._56_4_;
          iStack_1984 = auVar117._60_4_;
          auVar112 = vsubps_avx512f(auVar117,auVar60);
          bVar4 = (bool)((byte)uVar19 & 1);
          bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar21 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar21 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
          bVar11 = (bool)((byte)(uVar21 >> 7) & 1);
          bVar12 = (byte)((ulong)uVar19 >> 8);
          bVar13 = (bool)(bVar12 >> 1 & 1);
          bVar14 = (bool)(bVar12 >> 2 & 1);
          bVar15 = (bool)(bVar12 >> 3 & 1);
          bVar16 = (bool)(bVar12 >> 4 & 1);
          bVar17 = (bool)(bVar12 >> 5 & 1);
          bVar18 = (bool)(bVar12 >> 6 & 1);
          local_23c0._4_4_ = (uint)bVar5 * auVar112._4_4_ | (uint)!bVar5 * iStack_19bc;
          local_23c0._0_4_ = (uint)bVar4 * auVar112._0_4_ | (uint)!bVar4 * local_19c0;
          local_23c0._8_4_ = (uint)bVar6 * auVar112._8_4_ | (uint)!bVar6 * iStack_19b8;
          local_23c0._12_4_ = (uint)bVar7 * auVar112._12_4_ | (uint)!bVar7 * iStack_19b4;
          uStack_23b0._0_4_ = (uint)bVar8 * auVar112._16_4_ | (uint)!bVar8 * iStack_19b0;
          uStack_23b0._4_4_ = (uint)bVar9 * auVar112._20_4_ | (uint)!bVar9 * iStack_19ac;
          uStack_23a8._0_4_ = (uint)bVar10 * auVar112._24_4_ | (uint)!bVar10 * iStack_19a8;
          uStack_23a8._4_4_ = (uint)bVar11 * auVar112._28_4_ | (uint)!bVar11 * iStack_19a4;
          auVar102 = _local_23c0;
          uStack_23a0._0_4_ =
               (uint)(bVar12 & 1) * auVar112._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_19a0;
          uStack_23a0._4_4_ = (uint)bVar13 * auVar112._36_4_ | (uint)!bVar13 * iStack_199c;
          auVar103 = _local_23c0;
          uStack_2398._0_4_ = (uint)bVar14 * auVar112._40_4_ | (uint)!bVar14 * iStack_1998;
          uStack_2398._4_4_ = (uint)bVar15 * auVar112._44_4_ | (uint)!bVar15 * iStack_1994;
          auVar104 = _local_23c0;
          uStack_2390._0_4_ = (uint)bVar16 * auVar112._48_4_ | (uint)!bVar16 * iStack_1990;
          uStack_2390._4_4_ = (uint)bVar17 * auVar112._52_4_ | (uint)!bVar17 * iStack_198c;
          auVar105 = _local_23c0;
          uStack_2388._0_4_ = (uint)bVar18 * auVar112._56_4_ | (uint)!bVar18 * iStack_1988;
          uStack_2388._4_4_ =
               (uint)(bVar12 >> 7) * auVar112._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_1984;
          auVar112 = _local_23c0;
          uStack_23a8 = auVar102._24_8_;
          uStack_23a0 = auVar103._32_8_;
          uStack_2398 = auVar104._40_8_;
          uStack_2390 = auVar105._48_8_;
          uStack_2388 = auVar112._56_8_;
          auVar64._16_8_ = uStack_23b0;
          auVar64._0_16_ = local_23c0;
          auVar64._24_8_ = uStack_23a8;
          auVar64._32_8_ = uStack_23a0;
          auVar64._40_8_ = uStack_2398;
          auVar64._48_8_ = uStack_2390;
          auVar64._56_8_ = uStack_2388;
          auVar63._8_4_ = 0.6933594;
          auVar63._12_4_ = 0.6933594;
          auVar63._0_4_ = 0.6933594;
          auVar63._4_4_ = 0.6933594;
          auVar63._16_4_ = 0.6933594;
          auVar63._20_4_ = 0.6933594;
          auVar63._24_4_ = 0.6933594;
          auVar63._28_4_ = 0.6933594;
          auVar63._32_4_ = 0.6933594;
          auVar63._36_4_ = 0.6933594;
          auVar63._40_4_ = 0.6933594;
          auVar63._44_4_ = 0.6933594;
          auVar63._48_4_ = 0.6933594;
          auVar63._52_4_ = 0.6933594;
          auVar63._56_4_ = 0.6933594;
          auVar63._60_4_ = 0.6933594;
          auVar112 = vfnmadd213ps_avx512f(auVar63,auVar64,auVar118);
          auVar62._16_8_ = uStack_23b0;
          auVar62._0_16_ = local_23c0;
          auVar62._24_8_ = uStack_23a8;
          auVar62._32_8_ = uStack_23a0;
          auVar62._40_8_ = uStack_2398;
          auVar62._48_8_ = uStack_2390;
          auVar62._56_8_ = uStack_2388;
          auVar61._8_4_ = -0.00021219444;
          auVar61._12_4_ = -0.00021219444;
          auVar61._0_4_ = -0.00021219444;
          auVar61._4_4_ = -0.00021219444;
          auVar61._16_4_ = -0.00021219444;
          auVar61._20_4_ = -0.00021219444;
          auVar61._24_4_ = -0.00021219444;
          auVar61._28_4_ = -0.00021219444;
          auVar61._32_4_ = -0.00021219444;
          auVar61._36_4_ = -0.00021219444;
          auVar61._40_4_ = -0.00021219444;
          auVar61._44_4_ = -0.00021219444;
          auVar61._48_4_ = -0.00021219444;
          auVar61._52_4_ = -0.00021219444;
          auVar61._56_4_ = -0.00021219444;
          auVar61._60_4_ = -0.00021219444;
          auVar112 = vfnmadd213ps_avx512f(auVar61,auVar62,auVar112);
          auVar118 = vmulps_avx512f(auVar112,auVar112);
          local_24c0._8_4_ = 0.00019875691;
          local_24c0._12_4_ = 0.00019875691;
          local_24c0._0_4_ = 0.00019875691;
          local_24c0._4_4_ = 0.00019875691;
          auVar54._16_4_ = 0.00019875691;
          auVar54._20_4_ = 0.00019875691;
          auVar54._0_16_ = local_24c0._0_16_;
          auVar54._24_4_ = 0.00019875691;
          auVar54._28_4_ = 0.00019875691;
          auVar54._32_4_ = 0.00019875691;
          auVar54._36_4_ = 0.00019875691;
          auVar54._40_4_ = 0.00019875691;
          auVar54._44_4_ = 0.00019875691;
          auVar54._48_4_ = 0.00019875691;
          auVar54._52_4_ = 0.00019875691;
          auVar54._56_4_ = 0.00019875691;
          auVar54._60_4_ = 0.00019875691;
          auVar53._8_4_ = 0.0013981999;
          auVar53._12_4_ = 0.0013981999;
          auVar53._0_4_ = 0.0013981999;
          auVar53._4_4_ = 0.0013981999;
          auVar53._16_4_ = 0.0013981999;
          auVar53._20_4_ = 0.0013981999;
          auVar53._24_4_ = 0.0013981999;
          auVar53._28_4_ = 0.0013981999;
          auVar53._32_4_ = 0.0013981999;
          auVar53._36_4_ = 0.0013981999;
          auVar53._40_4_ = 0.0013981999;
          auVar53._44_4_ = 0.0013981999;
          auVar53._48_4_ = 0.0013981999;
          auVar53._52_4_ = 0.0013981999;
          auVar53._56_4_ = 0.0013981999;
          auVar53._60_4_ = 0.0013981999;
          auVar117 = vfmadd213ps_avx512f(auVar112,auVar54,auVar53);
          auVar52._8_4_ = 0.008333452;
          auVar52._12_4_ = 0.008333452;
          auVar52._0_4_ = 0.008333452;
          auVar52._4_4_ = 0.008333452;
          auVar52._16_4_ = 0.008333452;
          auVar52._20_4_ = 0.008333452;
          auVar52._24_4_ = 0.008333452;
          auVar52._28_4_ = 0.008333452;
          auVar52._32_4_ = 0.008333452;
          auVar52._36_4_ = 0.008333452;
          auVar52._40_4_ = 0.008333452;
          auVar52._44_4_ = 0.008333452;
          auVar52._48_4_ = 0.008333452;
          auVar52._52_4_ = 0.008333452;
          auVar52._56_4_ = 0.008333452;
          auVar52._60_4_ = 0.008333452;
          auVar117 = vfmadd213ps_avx512f(auVar112,auVar117,auVar52);
          auVar51._8_4_ = 0.041665796;
          auVar51._12_4_ = 0.041665796;
          auVar51._0_4_ = 0.041665796;
          auVar51._4_4_ = 0.041665796;
          auVar51._16_4_ = 0.041665796;
          auVar51._20_4_ = 0.041665796;
          auVar51._24_4_ = 0.041665796;
          auVar51._28_4_ = 0.041665796;
          auVar51._32_4_ = 0.041665796;
          auVar51._36_4_ = 0.041665796;
          auVar51._40_4_ = 0.041665796;
          auVar51._44_4_ = 0.041665796;
          auVar51._48_4_ = 0.041665796;
          auVar51._52_4_ = 0.041665796;
          auVar51._56_4_ = 0.041665796;
          auVar51._60_4_ = 0.041665796;
          auVar117 = vfmadd213ps_avx512f(auVar112,auVar117,auVar51);
          auVar50._8_4_ = 0.16666666;
          auVar50._12_4_ = 0.16666666;
          auVar50._0_4_ = 0.16666666;
          auVar50._4_4_ = 0.16666666;
          auVar50._16_4_ = 0.16666666;
          auVar50._20_4_ = 0.16666666;
          auVar50._24_4_ = 0.16666666;
          auVar50._28_4_ = 0.16666666;
          auVar50._32_4_ = 0.16666666;
          auVar50._36_4_ = 0.16666666;
          auVar50._40_4_ = 0.16666666;
          auVar50._44_4_ = 0.16666666;
          auVar50._48_4_ = 0.16666666;
          auVar50._52_4_ = 0.16666666;
          auVar50._56_4_ = 0.16666666;
          auVar50._60_4_ = 0.16666666;
          auVar117 = vfmadd213ps_avx512f(auVar112,auVar117,auVar50);
          auVar49._8_4_ = 0.5;
          auVar49._12_4_ = 0.5;
          auVar49._0_4_ = 0.5;
          auVar49._4_4_ = 0.5;
          auVar49._16_4_ = 0.5;
          auVar49._20_4_ = 0.5;
          auVar49._24_4_ = 0.5;
          auVar49._28_4_ = 0.5;
          auVar49._32_4_ = 0.5;
          auVar49._36_4_ = 0.5;
          auVar49._40_4_ = 0.5;
          auVar49._44_4_ = 0.5;
          auVar49._48_4_ = 0.5;
          auVar49._52_4_ = 0.5;
          auVar49._56_4_ = 0.5;
          auVar49._60_4_ = 0.5;
          auVar117 = vfmadd213ps_avx512f(auVar112,auVar117,auVar49);
          auVar112 = vfmadd213ps_avx512f(auVar118,auVar117,auVar112);
          auVar59._8_4_ = 1.0;
          auVar59._12_4_ = 1.0;
          auVar59._0_4_ = 1.0;
          auVar59._4_4_ = 1.0;
          auVar59._16_4_ = 1.0;
          auVar59._20_4_ = 1.0;
          auVar59._24_4_ = 1.0;
          auVar59._28_4_ = 1.0;
          auVar59._32_4_ = 1.0;
          auVar59._36_4_ = 1.0;
          auVar59._40_4_ = 1.0;
          auVar59._44_4_ = 1.0;
          auVar59._48_4_ = 1.0;
          auVar59._52_4_ = 1.0;
          auVar59._56_4_ = 1.0;
          auVar59._60_4_ = 1.0;
          auVar117 = vaddps_avx512f(auVar112,auVar59);
          auVar65._16_8_ = uStack_23b0;
          auVar65._0_16_ = local_23c0;
          auVar65._24_8_ = uStack_23a8;
          auVar65._32_8_ = uStack_23a0;
          auVar65._40_8_ = uStack_2398;
          auVar65._48_8_ = uStack_2390;
          auVar65._56_8_ = uStack_2388;
          auVar112 = vcvttps2dq_avx512f(auVar65);
          vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar118 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar112 = vpaddd_avx512f(auVar112,auVar118);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vpslld_avx512f(auVar112,ZEXT416(0x17));
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmovdqa64_avx512f(auVar112);
          auVar112 = vmulps_avx512f(auVar117,auVar112);
          auVar112 = vaddps_avx512f(auVar116,auVar112);
          auVar118 = vrcp14ps_avx512f(auVar112);
          auVar117 = vmulps_avx512f(auVar116,auVar118);
          auVar112 = vfmsub213ps_avx512f(auVar117,auVar112,auVar116);
          auVar112 = vfnmadd213ps_avx512f(auVar112,auVar118,auVar117);
          auVar118 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar118 = vpxord_avx512f(auVar119,auVar118);
          auVar112 = vfmadd213ps_avx512f(auVar115,auVar112,auVar118);
          local_5740 = vmulps_avx512f(local_5e00,auVar112);
          break;
        case 6:
          auVar112 = vbroadcastss_avx512f(ZEXT416(*(uint *)*plVar22));
          auVar118 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*plVar22 + 4)));
          auVar119 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar112 = vfmadd213ps_avx512f(auVar112,local_5e00,auVar118);
          auVar112 = vmaxps_avx512f(auVar112,ZEXT1664(ZEXT816(0)));
          auVar112 = vminps_avx512f(auVar112,auVar119);
          local_5740 = vmulps_avx512f(auVar112,local_5e00);
          break;
        default:
          local_5740 = local_5e00;
        }
        *local_5d38 = local_5740;
        local_5d38 = local_5d38 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack1to16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m512 _sum = _mm512_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm512_loadu_ps(bias_data_ptr + p * 16);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        const float* sptr = m.row(sy);

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            float val = sptr[sx];

                            int k = y * kernel_w + x;

                            __m512 _val = _mm512_set1_ps(val);
                            __m512 _w = _mm512_load_ps(kptr + k * 16);
                            _sum = _mm512_fmadd_ps(_val, _w, _sum);
                        }
                    }

                    kptr += maxk * 16;
                }

                _sum = activation_avx512(_sum, activation_type, activation_params);

                _mm512_storeu_ps(outptr, _sum);
                outptr += 16;
            }
        }
    }
}